

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

uint __thiscall
chrono::fea::ChContactTriangleXYZ::GetSubBlockOffset(ChContactTriangleXYZ *this,int nblock)

{
  uint uVar1;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (nblock == 2) {
    p_Var2 = &(this->mnode3).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>;
  }
  else if (nblock == 1) {
    p_Var2 = &(this->mnode2).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>;
  }
  else {
    if (nblock != 0) {
      return 0;
    }
    p_Var2 = &(this->mnode1).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_18,p_Var2);
  uVar1 = *(uint *)((long)&((local_18._M_ptr)->super_ChNodeFEAbase).m_TotalMass +
                   (long)(((local_18._M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return uVar1;
}

Assistant:

unsigned int ChContactTriangleXYZ::GetSubBlockOffset(int nblock) {
    if (nblock == 0)
        return GetNode1()->NodeGetOffset_w();
    if (nblock == 1)
        return GetNode2()->NodeGetOffset_w();
    if (nblock == 2)
        return GetNode3()->NodeGetOffset_w();
    return 0;
}